

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

string * __thiscall
duckdb::BaseStatistics::ToString_abi_cxx11_(string *__return_storage_ptr__,BaseStatistics *this)

{
  idx_t iVar1;
  StatisticsType SVar2;
  BaseStatistics *stats;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string *msg;
  char *params;
  allocator local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  Exception local_80 [2];
  string local_60;
  string local_40 [32];
  
  params = "false";
  msg = (string *)0x1050784;
  if (this->has_null != false) {
    msg = (string *)0x105f2e9;
  }
  if (this->has_no_null != false) {
    params = "true";
  }
  ::std::__cxx11::string::string(local_40,"%s%s",(allocator *)&local_e0);
  ::std::__cxx11::string::string
            ((string *)local_80,"[Has Null: %s, Has No Null: %s]",(allocator *)&local_100);
  Exception::ConstructMessage<char_const*,char_const*>(&local_60,local_80,msg,params,(char *)in_R8);
  iVar1 = this->distinct_count;
  if (iVar1 == 0) {
    ::std::__cxx11::string::string((string *)&local_c0,anon_var_dwarf_4b71df5 + 9,&local_101);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_a0,"[Approx Unique: %lld]",&local_101);
    Exception::ConstructMessage<unsigned_long>(&local_c0,&local_a0,this->distinct_count);
  }
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_40,&local_60,&local_c0,in_R8);
  ::std::__cxx11::string::~string((string *)&local_c0);
  if (iVar1 != 0) {
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string(local_40);
  SVar2 = GetStatsType(&this->type);
  switch(SVar2) {
  case NUMERIC_STATS:
    NumericStats::ToString_abi_cxx11_(&local_100,(NumericStats *)this,stats);
    ::std::operator+(&local_e0,&local_100,__return_storage_ptr__);
    break;
  case STRING_STATS:
    StringStats::ToString_abi_cxx11_(&local_100,(StringStats *)this,stats);
    ::std::operator+(&local_e0,&local_100,__return_storage_ptr__);
    break;
  case LIST_STATS:
    ListStats::ToString_abi_cxx11_(&local_100,(ListStats *)this,stats);
    ::std::operator+(&local_e0,&local_100,__return_storage_ptr__);
    break;
  case STRUCT_STATS:
    StructStats::ToString_abi_cxx11_(&local_100,(StructStats *)this,stats);
    ::std::operator+(&local_e0,&local_100,__return_storage_ptr__);
    break;
  default:
    goto switchD_005111ae_caseD_4;
  case ARRAY_STATS:
    ArrayStats::ToString_abi_cxx11_(&local_100,(ArrayStats *)this,stats);
    ::std::operator+(&local_e0,&local_100,__return_storage_ptr__);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_100);
switchD_005111ae_caseD_4:
  return __return_storage_ptr__;
}

Assistant:

string BaseStatistics::ToString() const {
	auto has_n = has_null ? "true" : "false";
	auto has_n_n = has_no_null ? "true" : "false";
	string result =
	    StringUtil::Format("%s%s", StringUtil::Format("[Has Null: %s, Has No Null: %s]", has_n, has_n_n),
	                       distinct_count > 0 ? StringUtil::Format("[Approx Unique: %lld]", distinct_count) : "");
	switch (GetStatsType()) {
	case StatisticsType::NUMERIC_STATS:
		result = NumericStats::ToString(*this) + result;
		break;
	case StatisticsType::STRING_STATS:
		result = StringStats::ToString(*this) + result;
		break;
	case StatisticsType::LIST_STATS:
		result = ListStats::ToString(*this) + result;
		break;
	case StatisticsType::STRUCT_STATS:
		result = StructStats::ToString(*this) + result;
		break;
	case StatisticsType::ARRAY_STATS:
		result = ArrayStats::ToString(*this) + result;
		break;
	default:
		break;
	}
	return result;
}